

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

void WebPIDelete(WebPIDecoder *idec)

{
  long lVar1;
  VP8Io *in_RDI;
  
  if (in_RDI != (VP8Io *)0x0) {
    lVar1._0_4_ = in_RDI->crop_top;
    lVar1._4_4_ = in_RDI->crop_bottom;
    if (lVar1 != 0) {
      if (in_RDI->crop_left == 0) {
        if (in_RDI->width == 3) {
          VP8ExitCritical((VP8Decoder *)idec,in_RDI);
        }
        VP8Delete((VP8Decoder *)0x10d25d);
      }
      else {
        VP8LDelete((VP8LDecoder *)0x10d26f);
      }
    }
    ClearMemBuffer((MemBuffer *)0x10d281);
    WebPFreeDecBuffer((WebPDecBuffer *)0x10d291);
    WebPSafeFree((void *)0x10d29a);
  }
  return;
}

Assistant:

void WebPIDelete(WebPIDecoder* idec) {
  if (idec == NULL) return;
  if (idec->dec_ != NULL) {
    if (!idec->is_lossless_) {
      if (idec->state_ == STATE_VP8_DATA) {
        // Synchronize the thread, clean-up and check for errors.
        // TODO(vrabaud) do we care about the return result?
        (void)VP8ExitCritical((VP8Decoder*)idec->dec_, &idec->io_);
      }
      VP8Delete((VP8Decoder*)idec->dec_);
    } else {
      VP8LDelete((VP8LDecoder*)idec->dec_);
    }
  }
  ClearMemBuffer(&idec->mem_);
  WebPFreeDecBuffer(&idec->output_);
  WebPSafeFree(idec);
}